

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_check_status(uint16_t flags1,lys_module *mod1,char *name1,uint16_t flags2,lys_module *mod2,
                    char *name2,lys_node *node)

{
  lys_module *plVar1;
  lys_module *plVar2;
  char *pcVar3;
  char *pcVar4;
  ushort uVar5;
  int iVar6;
  ushort uVar7;
  
  uVar5 = flags1 & 0x38;
  if ((flags1 & 0x38) == 0) {
    uVar5 = 8;
  }
  uVar7 = flags2 & 0x38;
  if ((flags2 & 0x38) == 0) {
    uVar7 = 8;
  }
  iVar6 = 0;
  if (uVar5 < uVar7) {
    plVar1 = lys_main_module(mod1);
    plVar2 = lys_main_module(mod2);
    iVar6 = 0;
    if (plVar1 == plVar2) {
      pcVar3 = "current";
      if (uVar5 != 8) {
        pcVar3 = "deprecated";
      }
      pcVar4 = "obsolete";
      if (uVar7 != 0x20) {
        pcVar4 = "deprecated";
      }
      ly_vlog(mod1->ctx,LYE_INSTATUS,(uint)(node != (lys_node *)0x0) * 2,node,pcVar3,name1,
              "references",pcVar4,name2);
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int
lyp_check_status(uint16_t flags1, struct lys_module *mod1, const char *name1,
                 uint16_t flags2, struct lys_module *mod2, const char *name2,
                 const struct lys_node *node)
{
    uint16_t flg1, flg2;

    flg1 = (flags1 & LYS_STATUS_MASK) ? (flags1 & LYS_STATUS_MASK) : LYS_STATUS_CURR;
    flg2 = (flags2 & LYS_STATUS_MASK) ? (flags2 & LYS_STATUS_MASK) : LYS_STATUS_CURR;

    if ((flg1 < flg2) && (lys_main_module(mod1) == lys_main_module(mod2))) {
        LOGVAL(mod1->ctx, LYE_INSTATUS, node ? LY_VLOG_LYS : LY_VLOG_NONE, node,
               flg1 == LYS_STATUS_CURR ? "current" : "deprecated", name1, "references",
               flg2 == LYS_STATUS_OBSLT ? "obsolete" : "deprecated", name2);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}